

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::OptDst(GlobOpt *this,Instr **pInstr,Value *dstVal,Value *src1Val,Value *src2Val,
               Value *dstIndirIndexVal,Value *src1IndirIndexVal)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BailOutKind BVar4;
  ValueNumber VVar5;
  ValueNumber VVar6;
  Opnd *this_00;
  SymOpnd *this_01;
  PropertySymOpnd *opnd_00;
  IndirOpnd *this_02;
  ValueInfo *pVVar7;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar8;
  Opnd *pOVar9;
  RegOpnd *pRVar10;
  RegOpnd *pRVar11;
  undefined4 *puVar12;
  GlobOptBlockData *this_03;
  Value *this_04;
  Instr *pIVar13;
  Opnd *prevDst;
  Instr *prevInstr;
  Value *srcValue;
  StackSym *dstVarSym;
  RegOpnd *dst;
  StackSym *srcVarSym;
  RegOpnd *src;
  StackSym *symDst;
  BailOutKind bailOutKind;
  ValueType baseValueType;
  RegOpnd *baseOpnd;
  Opnd *opnd;
  Instr **instr;
  Value *dstIndirIndexVal_local;
  Value *src2Val_local;
  Value *src1Val_local;
  Value *dstVal_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  this_00 = IR::Instr::GetDst(*pInstr);
  if (this_00 != (Opnd *)0x0) {
    bVar2 = IR::Opnd::IsSymOpnd(this_00);
    if (bVar2) {
      this_01 = IR::Opnd::AsSymOpnd(this_00);
      bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_01);
      if (bVar2) {
        pIVar13 = *pInstr;
        opnd_00 = IR::Opnd::AsPropertySymOpnd(this_00);
        FinishOptPropOp(this,pIVar13,opnd_00,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
      }
    }
    bVar2 = IR::Opnd::IsIndirOpnd(this_00);
    if ((bVar2) && (bVar2 = IsLoopPrePass(this), !bVar2)) {
      this_02 = IR::Opnd::AsIndirOpnd(this_00);
      _bailOutKind = IR::IndirOpnd::GetBaseOpnd(this_02);
      symDst._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     IR::Opnd::GetValueType(&_bailOutKind->super_Opnd);
      bVar2 = ValueType::IsLikelyNativeArray((ValueType *)((long)&symDst + 6));
      if (bVar2) {
        pOVar9 = IR::Instr::GetSrc1(*pInstr);
        bVar2 = IR::Opnd::IsVar(pOVar9);
        if (bVar2) {
          if ((*pInstr)->m_opcode == StElemC) {
            bVar2 = ValueType::IsLikelyNativeArray((ValueType *)((long)&symDst + 6));
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0xbf2,"(baseValueType.IsLikelyNativeArray())",
                                 "baseValueType.IsLikelyNativeArray()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 0;
            }
            bVar2 = IR::Instr::HasBailOutInfo(*pInstr);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0xbf3,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 0;
            }
            GenerateBailAtOperation(this,pInstr,BailOutConventionalNativeArrayAccessOnly);
          }
          else {
            bVar2 = IR::Instr::HasBailOutInfo(*pInstr);
            if (bVar2) {
              symDst._0_4_ = IR::Instr::GetBailOutKind(*pInstr);
              BVar4 = IR::operator&((BailOutKind)symDst,BailOutOnArrayAccessHelperCall);
              if (BVar4 != BailOutInvalid) {
                IR::operator-=((BailOutKind *)&symDst,0x20000);
              }
              if ((BailOutKind)symDst == BailOutOnImplicitCallsPreOp) {
                IR::operator-=((BailOutKind *)&symDst,5);
              }
              if ((BailOutKind)symDst == BailOutInvalid) {
                IR::Instr::ClearBailOutInfo(*pInstr);
              }
              else {
                IR::Instr::SetBailOutKind(*pInstr,(BailOutKind)symDst);
              }
            }
          }
        }
      }
    }
  }
  ProcessKills(this,*pInstr);
  src1Val_local = dstVal;
  if (this_00 == (Opnd *)0x0) goto LAB_0058a4e1;
  if (dstVal == (Value *)0x0) {
    src1Val_local = ValueNumberDst(this,pInstr,src1Val,src2Val);
  }
  bVar2 = IsLoopPrePass(this);
  if (bVar2) {
    bVar2 = IR::Opnd::IsRegOpnd(this_00);
    if (bVar2) {
      pRVar10 = IR::Opnd::AsRegOpnd(this_00);
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->rootLoopPrePass->symsDefInLoop,(pRVar10->m_sym->super_Sym).m_id);
    }
  }
  else if (src1Val_local != (Value *)0x0) {
    pVVar7 = ::Value::GetValueInfo(src1Val_local);
    paVar8 = &ValueInfo::Type(pVVar7)->field_0;
    IR::Opnd::SetValueType
              (this_00,(ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar8->field_0);
    if (((this->currentBlock->loop != (Loop *)0x0) && (bVar2 = IsLoopPrePass(this), !bVar2)) &&
       (((*pInstr)->m_opcode == Ld_A || ((*pInstr)->m_opcode == Ld_I4)))) {
      pOVar9 = IR::Instr::GetSrc1(*pInstr);
      bVar2 = IR::Opnd::IsRegOpnd(pOVar9);
      if ((bVar2) && (bVar2 = Func::IsJitInDebugMode(this->func), !bVar2)) {
        pOVar9 = IR::Instr::GetSrc1(*pInstr);
        pRVar10 = IR::Opnd::AsRegOpnd(pOVar9);
        dst = (RegOpnd *)pRVar10->m_sym;
        bVar2 = StackSym::IsTypeSpec((StackSym *)dst);
        if ((bVar2) &&
           (dst = (RegOpnd *)StackSym::GetVarEquivSym((StackSym *)dst,(Func *)0x0),
           (StackSym *)dst == (StackSym *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xc3e,"(srcVarSym)","srcVarSym");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        pVVar7 = ::Value::GetValueInfo(src1Val_local);
        pRVar11 = (RegOpnd *)ValueInfo::GetSymStore(pVVar7);
        if (pRVar11 == dst) {
          pRVar11 = IR::Opnd::AsRegOpnd(this_00);
          srcValue = (Value *)pRVar11->m_sym;
          bVar2 = StackSym::IsTypeSpec((StackSym *)srcValue);
          if ((bVar2) &&
             (srcValue = (Value *)StackSym::GetVarEquivSym((StackSym *)srcValue,(Func *)0x0),
             (StackSym *)srcValue == (StackSym *)0x0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xc4a,"(dstVarSym)","dstVarSym");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((this->currentBlock->loop->regAlloc).liveOnBackEdgeSyms,
                             srcValue[1].valueNumber);
          if (BVar3 != '\0') {
            this_03 = CurrentBlockData(this);
            this_04 = GlobOptBlockData::FindValue(this_03,(Sym *)dst);
            VVar5 = ::Value::GetValueNumber(this_04);
            VVar6 = ::Value::GetValueNumber(src1Val_local);
            if (VVar5 == VVar6) {
              bVar2 = IR::Opnd::GetIsDead(&pRVar10->super_Opnd);
              if (bVar2) {
LAB_0058a4a8:
                pVVar7 = ::Value::GetValueInfo(src1Val_local);
                SetSymStoreDirect(this,pVVar7,(Sym *)srcValue);
              }
              else {
                pIVar13 = IR::Instr::GetPrevRealInstrOrLabel(*pInstr);
                pOVar9 = IR::Instr::GetDst(pIVar13);
                if ((pOVar9 != (Opnd *)0x0) &&
                   (bVar2 = IR::RegOpnd::IsEqualInternal(pRVar10,pOVar9), bVar2)) {
                  pOVar9 = IR::Instr::GetSrc1(pIVar13);
                  if (pOVar9 != (Opnd *)0x0) {
                    pOVar9 = IR::Instr::GetSrc1(pIVar13);
                    bVar2 = IR::Opnd::IsEqual(&pRVar11->super_Opnd,pOVar9);
                    if (bVar2) goto LAB_0058a4a8;
                  }
                  pOVar9 = IR::Instr::GetSrc2(pIVar13);
                  if (pOVar9 != (Opnd *)0x0) {
                    pOVar9 = IR::Instr::GetSrc2(pIVar13);
                    bVar2 = IR::Opnd::IsEqual(&pRVar11->super_Opnd,pOVar9);
                    if (bVar2) goto LAB_0058a4a8;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ValueNumberObjectType(this,this_00,*pInstr);
LAB_0058a4e1:
  CSEAddInstr(this,this->currentBlock,*pInstr,src1Val_local,src1Val,src2Val,dstIndirIndexVal,
              src1IndirIndexVal);
  return src1Val_local;
}

Assistant:

Value*
GlobOpt::OptDst(
    IR::Instr ** pInstr,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    Value *dstIndirIndexVal,
    Value *src1IndirIndexVal)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *opnd = instr->GetDst();

    if (opnd)
    {
        if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
        }

        if (opnd->IsIndirOpnd() && !this->IsLoopPrePass())
        {
            IR::RegOpnd *baseOpnd = opnd->AsIndirOpnd()->GetBaseOpnd();
            const ValueType baseValueType(baseOpnd->GetValueType());
            if ((
                    baseValueType.IsLikelyNativeArray() ||
                #ifdef _M_IX86
                    (
                        !AutoSystemInfo::Data.SSE2Available() &&
                        baseValueType.IsLikelyObject() &&
                        (
                            baseValueType.GetObjectType() == ObjectType::Float32Array ||
                            baseValueType.GetObjectType() == ObjectType::Float64Array
                        )
                    )
                #else
                    false
                #endif
                ) &&
                instr->GetSrc1()->IsVar())
            {
                if(instr->m_opcode == Js::OpCode::StElemC)
                {
                    // StElemC has different code that handles native array conversion or missing value stores. Add a bailout
                    // for those cases.
                    Assert(baseValueType.IsLikelyNativeArray());
                    Assert(!instr->HasBailOutInfo());
                    GenerateBailAtOperation(&instr, IR::BailOutConventionalNativeArrayAccessOnly);
                }
                else if(instr->HasBailOutInfo())
                {
                    // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
                    // path. Note that the removed bailouts should not be necessary for correctness. Bailout on native array
                    // conversion will be handled automatically as normal.
                    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
                    if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
                    {
                        bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
                    }
                    if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
                    {
                        bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
                    }
                    if(bailOutKind)
                    {
                        instr->SetBailOutKind(bailOutKind);
                    }
                    else
                    {
                        instr->ClearBailOutInfo();
                    }
                }
            }
        }
    }

    this->ProcessKills(instr);

    if (opnd)
    {
        if (dstVal == nullptr)
        {
            dstVal = ValueNumberDst(pInstr, src1Val, src2Val);
        }
        if (this->IsLoopPrePass())
        {
            // Keep track of symbols defined in the loop.
            if (opnd->IsRegOpnd())
            {
                StackSym *symDst = opnd->AsRegOpnd()->m_sym;
                rootLoopPrePass->symsDefInLoop->Set(symDst->m_id);
            }
        }
        else if (dstVal)
        {
            opnd->SetValueType(dstVal->GetValueInfo()->Type());
            if (currentBlock->loop &&
                !IsLoopPrePass() &&
                (instr->m_opcode == Js::OpCode::Ld_A || instr->m_opcode == Js::OpCode::Ld_I4) &&
                instr->GetSrc1()->IsRegOpnd() &&
                !func->IsJitInDebugMode())
            {
                // Look for the following patterns:
                //
                // Pattern 1:
                //     s1[liveOnBackEdge] = s3[dead]
                //
                // Pattern 2:
                //     s3 = operation(s1[liveOnBackEdge], s2)
                //     s1[liveOnBackEdge] = s3
                //
                // In both patterns, s1 and s3 have the same value by the end. Prefer to use s1 as the sym store instead of s3
                // since s1 is live on back-edge, as otherwise, their lifetimes overlap, requiring two registers to hold the
                // value instead of one.
                do
                {
                    IR::RegOpnd *const src = instr->GetSrc1()->AsRegOpnd();
                    StackSym *srcVarSym = src->m_sym;
                    if(srcVarSym->IsTypeSpec())
                    {
                        srcVarSym = srcVarSym->GetVarEquivSym(nullptr);
                        Assert(srcVarSym);
                    }
                    if(dstVal->GetValueInfo()->GetSymStore() != srcVarSym)
                    {
                        break;
                    }

                    IR::RegOpnd *const dst = opnd->AsRegOpnd();
                    StackSym *dstVarSym = dst->m_sym;
                    if(dstVarSym->IsTypeSpec())
                    {
                        dstVarSym = dstVarSym->GetVarEquivSym(nullptr);
                        Assert(dstVarSym);
                    }
                    if(!currentBlock->loop->regAlloc.liveOnBackEdgeSyms->Test(dstVarSym->m_id))
                    {
                        break;
                    }

                    Value *const srcValue = CurrentBlockData()->FindValue(srcVarSym);
                    if(srcValue->GetValueNumber() != dstVal->GetValueNumber())
                    {
                        break;
                    }

                    if(!src->GetIsDead())
                    {
                        IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                        IR::Opnd *const prevDst = prevInstr->GetDst();
                        if(!prevDst ||
                            !src->IsEqualInternal(prevDst) ||
                            !(
                                (prevInstr->GetSrc1() && dst->IsEqual(prevInstr->GetSrc1())) ||
                                (prevInstr->GetSrc2() && dst->IsEqual(prevInstr->GetSrc2()))
                            ))
                        {
                            break;
                        }
                    }

                    this->SetSymStoreDirect(dstVal->GetValueInfo(), dstVarSym);
                } while(false);
            }
        }

        this->ValueNumberObjectType(opnd, instr);
    }

    this->CSEAddInstr(this->currentBlock, *pInstr, dstVal, src1Val, src2Val, dstIndirIndexVal, src1IndirIndexVal);

    return dstVal;
}